

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MSA.cpp
# Opt level: O0

shared_ptr<Storage::Disk::Track> __thiscall
Storage::Disk::MSA::get_track_at_position(MSA *this,Address address)

{
  bool bVar1;
  int iVar2;
  reference this_00;
  uchar *source;
  int in_EDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  shared_ptr<Storage::Disk::Track> sVar4;
  value_type *track;
  int position;
  MSA *this_local;
  Address address_local;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  
  address_local = (Address)this;
  if (in_EDX < (int)(uint)*(ushort *)((long)address + 0xf2)) {
    this_local._0_4_ = in_EDX;
    iVar2 = HeadPosition::as_int((HeadPosition *)((long)&this_local + 4));
    if (iVar2 < (int)(uint)*(ushort *)((long)address + 0xf4)) {
      std::shared_ptr<Storage::Disk::Track>::shared_ptr
                ((shared_ptr<Storage::Disk::Track> *)this,(nullptr_t)0x0);
      _Var3._M_pi = extraout_RDX_00;
    }
    else if ((int)(uint)*(ushort *)((long)address + 0xf6) < iVar2) {
      std::shared_ptr<Storage::Disk::Track>::shared_ptr
                ((shared_ptr<Storage::Disk::Track> *)this,(nullptr_t)0x0);
      _Var3._M_pi = extraout_RDX_01;
    }
    else {
      this_00 = std::
                vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                ::operator[]((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                              *)((long)address + 0xf8),
                             (long)(int)(iVar2 - (uint)*(ushort *)((long)address + 0xf4)) *
                             (ulong)*(ushort *)((long)address + 0xf2) + (long)(int)this_local);
      bVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::empty(this_00);
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        __assert_fail("!track.empty()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Storage/Disk/DiskImage/Formats/MSA.cpp"
                      ,0x56,
                      "virtual std::shared_ptr< ::Storage::Disk::Track> Storage::Disk::MSA::get_track_at_position(::Storage::Disk::Track::Address)"
                     );
      }
      source = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(this_00);
      sVar4 = track_for_sectors((Disk *)this,source,(uint)*(ushort *)((long)address + 0xf0),
                                (uint8_t)iVar2,(uint8_t)this_local,'\x01','\x02',Double);
      _Var3 = sVar4.super___shared_ptr<Storage::Disk::Track,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              ._M_pi;
    }
  }
  else {
    std::shared_ptr<Storage::Disk::Track>::shared_ptr
              ((shared_ptr<Storage::Disk::Track> *)this,(nullptr_t)0x0);
    _Var3._M_pi = extraout_RDX;
  }
  sVar4.super___shared_ptr<Storage::Disk::Track,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var3._M_pi;
  sVar4.super___shared_ptr<Storage::Disk::Track,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<Storage::Disk::Track>)
         sVar4.super___shared_ptr<Storage::Disk::Track,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<::Storage::Disk::Track> MSA::get_track_at_position(::Storage::Disk::Track::Address address) {
	if(address.head >= sides_) return nullptr;

	const auto position = address.position.as_int();
	if(position < starting_track_) return nullptr;
	if(position > ending_track_) return nullptr;

	const auto &track = uncompressed_tracks_[size_t(position - starting_track_) * size_t(sides_) + size_t(address.head)];
	assert(!track.empty());
	return track_for_sectors(track.data(), sectors_per_track_, uint8_t(position), uint8_t(address.head), 1, 2, Storage::Encodings::MFM::Density::Double);
}